

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::~GraphCycles(GraphCycles *this)

{
  uint uVar1;
  Node **ppNVar2;
  void *v;
  long lVar3;
  
  ppNVar2 = (this->rep_->nodes_).ptr_;
  uVar1 = (this->rep_->nodes_).size_;
  for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    v = *(void **)((long)ppNVar2 + lVar3);
    if (v != (void *)0x0) {
      anon_unknown_0::Vec<int>::~Vec((Vec<int> *)((long)v + 0x50));
      anon_unknown_0::Vec<int>::~Vec((Vec<int> *)((long)v + 0x18));
      base_internal::LowLevelAlloc::Free(v);
    }
  }
  Rep::~Rep(this->rep_);
  base_internal::LowLevelAlloc::Free(this->rep_);
  return;
}

Assistant:

GraphCycles::~GraphCycles() {
  for (auto* node : rep_->nodes_) {
    if (node == nullptr) { continue; }
    node->Node::~Node();
    base_internal::LowLevelAlloc::Free(node);
  }
  rep_->Rep::~Rep();
  base_internal::LowLevelAlloc::Free(rep_);
}